

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateInitializers
          (ImmutableMessageGenerator *this,Printer *printer)

{
  int iVar1;
  FieldDescriptor *pFVar2;
  OneofDescriptor *pOVar3;
  ImmutableFieldGenerator *pIVar4;
  int local_1c;
  int i;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    if (iVar1 <= local_1c) break;
    pFVar2 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_1c);
    pOVar3 = FieldDescriptor::containing_oneof(pFVar2);
    if (pOVar3 == (OneofDescriptor *)0x0) {
      pFVar2 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_1c);
      pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,pFVar2);
      (*pIVar4->_vptr_ImmutableFieldGenerator[7])(pIVar4,printer);
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateInitializers(io::Printer* printer) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      field_generators_.get(descriptor_->field(i))
          .GenerateInitializationCode(printer);
    }
  }
}